

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

SubexpressionNode __thiscall
JsUtil::Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
::Pop(Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
      *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Type *pTVar3;
  SubexpressionNode SVar4;
  
  pTVar3 = List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(&this->list,
                  (this->list).
                  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
                  .count + -1);
  uVar1 = pTVar3->node;
  uVar2 = pTVar3->beginCodeSpan;
  SVar4.beginCodeSpan = uVar2;
  SVar4.node = (ParseNode *)uVar1;
  List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAt(&this->list,
             (this->list).
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             .count + -1);
  SVar4._12_4_ = 0;
  return SVar4;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }